

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphFileOperations.hpp
# Opt level: O0

graphProperties *
floorplan::GraphFileOperations::loadGraphFromXML
          (graphProperties *__return_storage_ptr__,string *filenamePath,floorplanGraph *outGraph,
          string *rootNodeName)

{
  boost *this;
  auto_any_t paVar1;
  bool bVar2;
  int iVar3;
  undefined8 uVar4;
  self_type *psVar5;
  long lVar6;
  ulong uVar7;
  vertex_bundled *pvVar8;
  size_type sVar9;
  reference pvVar10;
  char *pcVar11;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  data_type *pdVar12;
  size_type sVar13;
  mapped_type *ppvVar14;
  adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>::config>_>
  *in_R8;
  double dVar15;
  double y_;
  pair<bool,_void_*> pVar16;
  byte local_f6a;
  byte local_f0a;
  byte local_eb2;
  byte local_d6a;
  byte local_d1a;
  byte local_c82;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_bool> local_c18;
  undefined1 local_bf8 [8];
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_bool> ret;
  Vertex v2;
  Vertex v1;
  long local_ba8;
  size_t foundDot_3;
  string targetSpaceName;
  string local_b78 [32];
  type local_b58;
  value_type *j;
  auto_any<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator>
  aStack_b48;
  bool _foreach_continue187;
  auto_any_base *local_b40;
  auto_any_t _foreach_end187;
  auto_any_base *local_b30;
  auto_any_t _foreach_cur187;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b20;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_af0;
  auto_any_t local_ae8;
  auto_any_t _foreach_col187;
  string local_ad8 [32];
  type local_ab8;
  value_type *i_2;
  auto_any<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator>
  aStack_aa8;
  bool _foreach_continue181;
  auto_any_base *local_aa0;
  auto_any_t _foreach_end181;
  auto_any_base *local_a90;
  auto_any_t _foreach_cur181;
  auto_any_t local_a80;
  auto_any_t _foreach_col181;
  long local_a58;
  size_t foundDot_2;
  string local_a48;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a28;
  undefined1 local_9e0 [8];
  string sourceSpaceName;
  string local_9b8 [32];
  type local_998;
  value_type *v_1;
  auto_any<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator>
  aStack_988;
  bool _foreach_continue172;
  auto_any_base *local_980;
  auto_any_t _foreach_end172;
  auto_any_base *local_970;
  auto_any_t _foreach_cur172;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_960;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_930;
  auto_any_t local_928;
  auto_any_t _foreach_col172;
  undefined1 auStack_918 [4];
  int i_1;
  LineSegment lsegment;
  string local_8b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_890;
  string local_848;
  allocator<char> local_821;
  string local_820;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_800;
  string local_7b8;
  Point2D local_798;
  allocator<char> local_781;
  string local_780 [39];
  allocator<char> local_759;
  string local_758;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_738;
  string local_6f0;
  allocator<char> local_6c9;
  string local_6c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_6a8;
  string local_660;
  allocator<char> local_639;
  string local_638;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_618;
  string local_5d0;
  allocator<char> local_5a9;
  string local_5a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_588;
  string local_540;
  allocator<char> local_519;
  string local_518 [39];
  allocator<char> local_4f1;
  string local_4f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4d0;
  string local_488;
  allocator<char> local_461;
  string local_460;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_440;
  string local_3f8;
  allocator<char> local_3d1;
  string local_3d0 [32];
  char *local_3b0;
  char *endptr;
  value_type *l;
  auto_any<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator>
  aStack_398;
  bool _foreach_continue127;
  auto_any_base *local_390;
  auto_any_t _foreach_end127;
  auto_any_base *local_380;
  auto_any_t _foreach_cur127;
  auto_any_t local_370;
  auto_any_t _foreach_col127;
  vector<Point2D,_std::allocator<Point2D>_> points;
  string local_348 [32];
  type local_328;
  value_type *i;
  auto_any<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator>
  aStack_318;
  bool _foreach_continue122;
  auto_any_base *local_310;
  auto_any_t _foreach_end122;
  auto_any_base *local_300;
  auto_any_t _foreach_cur122;
  auto_any_t local_2f0;
  auto_any_t _foreach_col122;
  Vertex currentVertex;
  byte local_2c0;
  pair<bool,_void_*> searchResult;
  size_t foundDot_1;
  string local_280;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_260;
  undefined1 local_218 [8];
  string spaceType;
  string local_1f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d0;
  undefined1 local_188 [8];
  string spaceName;
  string local_160 [32];
  type local_140;
  value_type *v;
  auto_any<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator>
  aStack_130;
  bool _foreach_continue95;
  auto_any_base *local_128;
  auto_any_t _foreach_end95;
  auto_any_base *local_118;
  auto_any_t _foreach_cur95;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_d8;
  auto_any_t local_d0;
  auto_any_t _foreach_col95;
  long local_a8;
  size_t foundDot;
  undefined1 local_98 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
  nameToVertex;
  locale local_58 [8];
  undefined1 local_50 [8];
  ptree XMLtree;
  string *rootNodeName_local;
  floorplanGraph *outGraph_local;
  string *filenamePath_local;
  graphProperties *currentGraphProperty;
  
  XMLtree.m_children = rootNodeName;
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::basic_ptree((basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_50);
  std::locale::locale(local_58);
  boost::property_tree::xml_parser::
  read_xml<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>
            (filenamePath,
             (basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_50,0,local_58);
  std::locale::~locale(local_58);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
         *)local_98);
  foundDot._7_1_ = 0;
  graphProperties::graphProperties(__return_storage_ptr__);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->filepath,(string *)filenamePath);
  local_a8 = std::__cxx11::string::find_last_of((char)filenamePath,0x2f);
  if (local_a8 == -1) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)filenamePath);
  }
  else {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&_foreach_col95,(ulong)filenamePath);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&_foreach_col95);
    std::__cxx11::string::~string((string *)&_foreach_col95);
  }
  uVar4 = std::__cxx11::string::c_str();
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_108,uVar4,0x2e);
  psVar5 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child((basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_50,&local_108);
  local_d8 = (basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)boost::foreach_detail_::
                contain<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>
                          (psVar5,(false_ *)0x0);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_108);
  local_d0 = (auto_any_t)&local_d8;
  bVar2 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_d0);
  if (!bVar2) {
    _foreach_end95 =
         (auto_any_t)
         boost::foreach_detail_::
         begin<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                   (local_d0,(type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                              *)0x0,(false_ *)0x0);
    local_118 = (auto_any_base *)&_foreach_end95;
    bVar2 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_118);
    if (!bVar2) {
      aStack_130 = boost::foreach_detail_::
                   end<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                             (local_d0,(type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                                        *)0x0,(false_ *)0x0);
      local_128 = (auto_any_base *)&stack0xfffffffffffffed0;
      bVar2 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_128);
      if (!bVar2) {
        v._7_1_ = 1;
        while( true ) {
          local_c82 = 0;
          if ((v._7_1_ & 1) != 0) {
            bVar2 = boost::foreach_detail_::
                    done<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                              (local_118,local_128,
                               (type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                                *)0x0);
            local_c82 = bVar2 ^ 0xff;
          }
          if ((local_c82 & 1) == 0) break;
          bVar2 = boost::foreach_detail_::set_false((bool *)((long)&v + 7));
          if (!bVar2) {
            local_140 = boost::foreach_detail_::
                        deref<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                                  (local_118,
                                   (type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                                    *)0x0);
            while (((v._7_1_ ^ 0xff) & 1) != 0) {
              pcVar11 = (char *)std::__cxx11::string::data();
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (local_160,pcVar11,(allocator<char> *)(spaceName.field_2._M_local_buf + 0xf)
                        );
              iVar3 = std::__cxx11::string::compare((char *)local_160);
              std::__cxx11::string::~string(local_160);
              std::allocator<char>::~allocator
                        ((allocator<char> *)(spaceName.field_2._M_local_buf + 0xf));
              if (iVar3 == 0) {
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::pair(&local_1d0,local_140);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1f0,"name",
                           (allocator<char> *)(spaceType.field_2._M_local_buf + 0xf));
                GetAttr((string *)local_188,&local_1d0,&local_1f0);
                std::__cxx11::string::~string((string *)&local_1f0);
                std::allocator<char>::~allocator
                          ((allocator<char> *)(spaceType.field_2._M_local_buf + 0xf));
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~pair(&local_1d0);
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::pair(&local_260,local_140);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_280,"type",(allocator<char> *)((long)&foundDot_1 + 7));
                GetAttr((string *)local_218,&local_260,&local_280);
                std::__cxx11::string::~string((string *)&local_280);
                std::allocator<char>::~allocator((allocator<char> *)((long)&foundDot_1 + 7));
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~pair(&local_260);
                lVar6 = std::__cxx11::string::find_first_of((char)local_188,0x2e);
                if (lVar6 != -1) {
                  std::__cxx11::string::substr((ulong)&searchResult.second,(ulong)local_188);
                  std::__cxx11::string::operator=
                            ((string *)local_188,(string *)&searchResult.second);
                  std::__cxx11::string::~string((string *)&searchResult.second);
                }
                uVar7 = std::__cxx11::string::empty();
                if ((uVar7 & 1) == 0) {
                  std::__cxx11::string::string((string *)&currentVertex,(string *)local_188);
                  pVar16 = GraphUtils::doesVertexExists((string *)&currentVertex,outGraph);
                  searchResult._0_8_ = pVar16.second;
                  local_2c0 = pVar16.first;
                  std::__cxx11::string::~string((string *)&currentVertex);
                  if ((local_2c0 & 1) == 0) {
                    _foreach_col122 =
                         (auto_any_t)
                         boost::
                         add_vertex<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>,boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>,boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>,boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>::config>>
                                   (&outGraph->super_type);
                    pvVar8 = boost::
                             adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>
                             ::operator[](outGraph,_foreach_col122);
                    std::__cxx11::string::operator=((string *)pvVar8,(string *)local_218);
                    pvVar8 = boost::
                             adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>
                             ::operator[](outGraph,_foreach_col122);
                    std::__cxx11::string::operator=
                              ((string *)&pvVar8->vertex_id,(string *)local_188);
                    paVar1 = _foreach_col122;
                    ppvVar14 = std::
                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                                             *)local_98,(key_type *)local_188);
                    *ppvVar14 = paVar1;
                  }
                  else {
                    _foreach_col122 = (auto_any_t)searchResult._0_8_;
                  }
                  _foreach_cur122 =
                       (auto_any_t)
                       boost::foreach_detail_::
                       contain<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>
                                 (&local_140->second,(false_ *)0x0);
                  local_2f0 = (auto_any_t)&_foreach_cur122;
                  bVar2 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_2f0);
                  if (!bVar2) {
                    _foreach_end122 =
                         (auto_any_t)
                         boost::foreach_detail_::
                         begin<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                                   (local_2f0,
                                    (type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                                     *)0x0,(false_ *)0x0);
                    local_300 = (auto_any_base *)&_foreach_end122;
                    bVar2 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_300);
                    if (!bVar2) {
                      aStack_318 = boost::foreach_detail_::
                                   end<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                                             (local_2f0,
                                              (type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                                               *)0x0,(false_ *)0x0);
                      local_310 = (auto_any_base *)&stack0xfffffffffffffce8;
                      bVar2 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool
                                        (local_310);
                      if (!bVar2) {
                        i._7_1_ = 1;
                        while( true ) {
                          local_d1a = 0;
                          if ((i._7_1_ & 1) != 0) {
                            bVar2 = boost::foreach_detail_::
                                    done<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                                              (local_300,local_310,
                                               (type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                                                *)0x0);
                            local_d1a = bVar2 ^ 0xff;
                          }
                          if ((local_d1a & 1) == 0) break;
                          bVar2 = boost::foreach_detail_::set_false((bool *)((long)&i + 7));
                          if (!bVar2) {
                            local_328 = boost::foreach_detail_::
                                        deref<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                                                  (local_300,
                                                   (
                                                  type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                                                  *)0x0);
                            while (((i._7_1_ ^ 0xff) & 1) != 0) {
                              pcVar11 = (char *)std::__cxx11::string::data();
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        (local_348,pcVar11,
                                         (allocator<char> *)
                                         ((long)&points.
                                                 super__Vector_base<Point2D,_std::allocator<Point2D>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage
                                         + 7));
                              iVar3 = std::__cxx11::string::compare((char *)local_348);
                              std::__cxx11::string::~string(local_348);
                              std::allocator<char>::~allocator
                                        ((allocator<char> *)
                                         ((long)&points.
                                                 super__Vector_base<Point2D,_std::allocator<Point2D>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage
                                         + 7));
                              if (iVar3 == 0) {
                                std::vector<Point2D,_std::allocator<Point2D>_>::vector
                                          ((vector<Point2D,_std::allocator<Point2D>_> *)
                                           &_foreach_col127);
                                _foreach_cur127 =
                                     (auto_any_t)
                                     boost::foreach_detail_::
                                     contain<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>
                                               (&local_328->second,(false_ *)0x0);
                                local_370 = (auto_any_t)&_foreach_cur127;
                                bVar2 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool
                                                  (local_370);
                                if (!bVar2) {
                                  _foreach_end127 =
                                       (auto_any_t)
                                       boost::foreach_detail_::
                                       begin<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                                                 (local_370,
                                                  (
                                                  type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                                                  *)0x0,(false_ *)0x0);
                                  local_380 = (auto_any_base *)&_foreach_end127;
                                  bVar2 = boost::foreach_detail_::auto_any_base::
                                          operator_cast_to_bool(local_380);
                                  if (!bVar2) {
                                    aStack_398 = boost::foreach_detail_::
                                                 end<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                                                           (local_370,
                                                            (
                                                  type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                                                  *)0x0,(false_ *)0x0);
                                    local_390 = (auto_any_base *)&stack0xfffffffffffffc68;
                                    bVar2 = boost::foreach_detail_::auto_any_base::
                                            operator_cast_to_bool(local_390);
                                    if (!bVar2) {
                                      l._7_1_ = 1;
                                      while( true ) {
                                        local_d6a = 0;
                                        if ((l._7_1_ & 1) != 0) {
                                          bVar2 = boost::foreach_detail_::
                                                  done<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                                                            (local_380,local_390,
                                                             (
                                                  type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                                                  *)0x0);
                                          local_d6a = bVar2 ^ 0xff;
                                        }
                                        if ((local_d6a & 1) == 0) break;
                                        bVar2 = boost::foreach_detail_::set_false
                                                          ((bool *)((long)&l + 7));
                                        if (!bVar2) {
                                          endptr = (char *)boost::foreach_detail_::
                                                                                                                      
                                                  deref<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                                                            (local_380,
                                                             (
                                                  type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                                                  *)0x0);
                                          while (((l._7_1_ ^ 0xff) & 1) != 0) {
                                            pcVar11 = (char *)std::__cxx11::string::data();
                                            std::allocator<char>::allocator();
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      (local_3d0,pcVar11,&local_3d1);
                                            iVar3 = std::__cxx11::string::compare((char *)local_3d0)
                                            ;
                                            std::__cxx11::string::~string(local_3d0);
                                            std::allocator<char>::~allocator(&local_3d1);
                                            if (iVar3 == 0) {
                                              std::
                                              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              ::pair(&local_440,
                                                     (
                                                  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)endptr);
                                              std::allocator<char>::allocator();
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&local_460,"x",&local_461);
                                              GetAttr(&local_3f8,&local_440,&local_460);
                                              pcVar11 = (char *)std::__cxx11::string::c_str();
                                              dVar15 = strtod(pcVar11,&local_3b0);
                                              pvVar8 = boost::
                                                  adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>
                                                  ::operator[](outGraph,_foreach_col122);
                                              (pvVar8->centroid).x = dVar15;
                                              std::__cxx11::string::~string((string *)&local_3f8);
                                              std::__cxx11::string::~string((string *)&local_460);
                                              std::allocator<char>::~allocator(&local_461);
                                              std::
                                              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              ::~pair(&local_440);
                                              std::
                                              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              ::pair(&local_4d0,
                                                     (
                                                  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)endptr);
                                              std::allocator<char>::allocator();
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&local_4f0,"y",&local_4f1);
                                              GetAttr(&local_488,&local_4d0,&local_4f0);
                                              pcVar11 = (char *)std::__cxx11::string::c_str();
                                              dVar15 = strtod(pcVar11,&local_3b0);
                                              pvVar8 = boost::
                                                  adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>
                                                  ::operator[](outGraph,_foreach_col122);
                                              (pvVar8->centroid).y = dVar15;
                                              std::__cxx11::string::~string((string *)&local_488);
                                              std::__cxx11::string::~string((string *)&local_4f0);
                                              std::allocator<char>::~allocator(&local_4f1);
                                              std::
                                              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              ::~pair(&local_4d0);
                                            }
                                            pcVar11 = (char *)std::__cxx11::string::data();
                                            std::allocator<char>::allocator();
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      (local_518,pcVar11,&local_519);
                                            iVar3 = std::__cxx11::string::compare((char *)local_518)
                                            ;
                                            std::__cxx11::string::~string(local_518);
                                            std::allocator<char>::~allocator(&local_519);
                                            if (iVar3 == 0) {
                                              std::
                                              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              ::pair(&local_588,
                                                     (
                                                  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)endptr);
                                              std::allocator<char>::allocator();
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&local_5a8,"maxx",&local_5a9);
                                              GetAttr(&local_540,&local_588,&local_5a8);
                                              pcVar11 = (char *)std::__cxx11::string::c_str();
                                              dVar15 = strtod(pcVar11,&local_3b0);
                                              pvVar8 = boost::
                                                  adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>
                                                  ::operator[](outGraph,_foreach_col122);
                                              pvVar8->maxx = dVar15;
                                              std::__cxx11::string::~string((string *)&local_540);
                                              std::__cxx11::string::~string((string *)&local_5a8);
                                              std::allocator<char>::~allocator(&local_5a9);
                                              std::
                                              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              ::~pair(&local_588);
                                              std::
                                              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              ::pair(&local_618,
                                                     (
                                                  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)endptr);
                                              std::allocator<char>::allocator();
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&local_638,"maxy",&local_639);
                                              GetAttr(&local_5d0,&local_618,&local_638);
                                              pcVar11 = (char *)std::__cxx11::string::c_str();
                                              dVar15 = strtod(pcVar11,&local_3b0);
                                              pvVar8 = boost::
                                                  adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>
                                                  ::operator[](outGraph,_foreach_col122);
                                              pvVar8->maxy = dVar15;
                                              std::__cxx11::string::~string((string *)&local_5d0);
                                              std::__cxx11::string::~string((string *)&local_638);
                                              std::allocator<char>::~allocator(&local_639);
                                              std::
                                              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              ::~pair(&local_618);
                                              std::
                                              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              ::pair(&local_6a8,
                                                     (
                                                  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)endptr);
                                              std::allocator<char>::allocator();
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&local_6c8,"minx",&local_6c9);
                                              GetAttr(&local_660,&local_6a8,&local_6c8);
                                              pcVar11 = (char *)std::__cxx11::string::c_str();
                                              dVar15 = strtod(pcVar11,&local_3b0);
                                              pvVar8 = boost::
                                                  adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>
                                                  ::operator[](outGraph,_foreach_col122);
                                              pvVar8->minx = dVar15;
                                              std::__cxx11::string::~string((string *)&local_660);
                                              std::__cxx11::string::~string((string *)&local_6c8);
                                              std::allocator<char>::~allocator(&local_6c9);
                                              std::
                                              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              ::~pair(&local_6a8);
                                              std::
                                              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              ::pair(&local_738,
                                                     (
                                                  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)endptr);
                                              std::allocator<char>::allocator();
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&local_758,"miny",&local_759);
                                              GetAttr(&local_6f0,&local_738,&local_758);
                                              pcVar11 = (char *)std::__cxx11::string::c_str();
                                              dVar15 = strtod(pcVar11,&local_3b0);
                                              pvVar8 = boost::
                                                  adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>
                                                  ::operator[](outGraph,_foreach_col122);
                                              pvVar8->miny = dVar15;
                                              std::__cxx11::string::~string((string *)&local_6f0);
                                              std::__cxx11::string::~string((string *)&local_758);
                                              std::allocator<char>::~allocator(&local_759);
                                              std::
                                              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              ::~pair(&local_738);
                                            }
                                            pcVar11 = (char *)std::__cxx11::string::data();
                                            std::allocator<char>::allocator();
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      (local_780,pcVar11,&local_781);
                                            iVar3 = std::__cxx11::string::compare((char *)local_780)
                                            ;
                                            std::__cxx11::string::~string(local_780);
                                            std::allocator<char>::~allocator(&local_781);
                                            if (iVar3 == 0) {
                                              std::
                                              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              ::pair(&local_800,
                                                     (
                                                  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)endptr);
                                              std::allocator<char>::allocator();
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&local_820,"x",&local_821);
                                              GetAttr(&local_7b8,&local_800,&local_820);
                                              pcVar11 = (char *)std::__cxx11::string::c_str();
                                              dVar15 = strtod(pcVar11,&local_3b0);
                                              std::
                                              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              ::pair(&local_890,
                                                     (
                                                  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)endptr);
                                              std::allocator<char>::allocator();
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&local_8b0,"y",
                                                         (allocator<char> *)
                                                         (lsegment.portalToRoom.field_2._M_local_buf
                                                         + 0xf));
                                              GetAttr(&local_848,&local_890,&local_8b0);
                                              pcVar11 = (char *)std::__cxx11::string::c_str();
                                              y_ = strtod(pcVar11,&local_3b0);
                                              Point2D::Point2D(&local_798,dVar15,y_);
                                              std::vector<Point2D,_std::allocator<Point2D>_>::
                                              push_back((vector<Point2D,_std::allocator<Point2D>_> *
                                                        )&_foreach_col127,&local_798);
                                              std::__cxx11::string::~string((string *)&local_848);
                                              std::__cxx11::string::~string((string *)&local_8b0);
                                              std::allocator<char>::~allocator
                                                        ((allocator<char> *)
                                                         (lsegment.portalToRoom.field_2._M_local_buf
                                                         + 0xf));
                                              std::
                                              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              ::~pair(&local_890);
                                              std::__cxx11::string::~string((string *)&local_7b8);
                                              std::__cxx11::string::~string((string *)&local_820);
                                              std::allocator<char>::~allocator(&local_821);
                                              std::
                                              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              ::~pair(&local_800);
                                            }
                                            l._7_1_ = 1;
                                          }
                                        }
                                        if ((l._7_1_ & 1) != 0) {
                                          boost::foreach_detail_::
                                          next<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                                                    (local_380,
                                                     (
                                                  type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                                                  *)0x0);
                                        }
                                      }
                                    }
                                  }
                                }
                                sVar9 = std::vector<Point2D,_std::allocator<Point2D>_>::size
                                                  ((vector<Point2D,_std::allocator<Point2D>_> *)
                                                   &_foreach_col127);
                                if (sVar9 != 0) {
                                  LineSegment::LineSegment((LineSegment *)auStack_918);
                                  for (_foreach_col172._4_4_ = 0;
                                      uVar7 = (ulong)_foreach_col172._4_4_,
                                      sVar9 = std::vector<Point2D,_std::allocator<Point2D>_>::size
                                                        ((vector<Point2D,_std::allocator<Point2D>_>
                                                          *)&_foreach_col127), uVar7 < sVar9;
                                      _foreach_col172._4_4_ = _foreach_col172._4_4_ + 1) {
                                    lVar6 = (long)_foreach_col172._4_4_;
                                    sVar9 = std::vector<Point2D,_std::allocator<Point2D>_>::size
                                                      ((vector<Point2D,_std::allocator<Point2D>_> *)
                                                       &_foreach_col127);
                                    if (lVar6 == sVar9 - 1) {
                                      pvVar10 = std::vector<Point2D,_std::allocator<Point2D>_>::
                                                operator[]((
                                                  vector<Point2D,_std::allocator<Point2D>_> *)
                                                  &_foreach_col127,(long)_foreach_col172._4_4_);
                                      _auStack_918 = pvVar10->x;
                                      lsegment.startPos.x = pvVar10->y;
                                      pvVar10 = std::vector<Point2D,_std::allocator<Point2D>_>::
                                                operator[]((
                                                  vector<Point2D,_std::allocator<Point2D>_> *)
                                                  &_foreach_col127,0);
                                      lsegment.startPos.y = pvVar10->x;
                                      lsegment.endPos.x = pvVar10->y;
                                    }
                                    else {
                                      pvVar10 = std::vector<Point2D,_std::allocator<Point2D>_>::
                                                operator[]((
                                                  vector<Point2D,_std::allocator<Point2D>_> *)
                                                  &_foreach_col127,(long)_foreach_col172._4_4_);
                                      _auStack_918 = pvVar10->x;
                                      lsegment.startPos.x = pvVar10->y;
                                      pvVar10 = std::vector<Point2D,_std::allocator<Point2D>_>::
                                                operator[]((
                                                  vector<Point2D,_std::allocator<Point2D>_> *)
                                                  &_foreach_col127,(long)(_foreach_col172._4_4_ + 1)
                                                  );
                                      lsegment.startPos.y = pvVar10->x;
                                      lsegment.endPos.x = pvVar10->y;
                                    }
                                    pvVar8 = boost::
                                             adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>
                                             ::operator[](outGraph,_foreach_col122);
                                    std::vector<LineSegment,_std::allocator<LineSegment>_>::
                                    push_back(&pvVar8->roomLayout,(value_type *)auStack_918);
                                  }
                                  LineSegment::~LineSegment((LineSegment *)auStack_918);
                                }
                                std::vector<Point2D,_std::allocator<Point2D>_>::~vector
                                          ((vector<Point2D,_std::allocator<Point2D>_> *)
                                           &_foreach_col127);
                              }
                              i._7_1_ = 1;
                            }
                          }
                          if ((i._7_1_ & 1) != 0) {
                            boost::foreach_detail_::
                            next<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                                      (local_300,
                                       (type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                                        *)0x0);
                          }
                        }
                      }
                    }
                  }
                }
                std::__cxx11::string::~string((string *)local_218);
                std::__cxx11::string::~string((string *)local_188);
              }
              v._7_1_ = 1;
            }
          }
          if ((v._7_1_ & 1) != 0) {
            boost::foreach_detail_::
            next<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                      (local_118,
                       (type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                        *)0x0);
          }
        }
      }
    }
  }
  uVar4 = std::__cxx11::string::c_str();
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_960,uVar4,0x2e);
  psVar5 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child((basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_50,&local_960);
  local_930 = (basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)boost::foreach_detail_::
                 contain<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>
                           (psVar5,(false_ *)0x0);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_960);
  local_928 = (auto_any_t)&local_930;
  bVar2 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_928);
  if (!bVar2) {
    _foreach_end172 =
         (auto_any_t)
         boost::foreach_detail_::
         begin<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                   (local_928,
                    (type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                     *)0x0,(false_ *)0x0);
    local_970 = (auto_any_base *)&_foreach_end172;
    bVar2 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_970);
    if (!bVar2) {
      aStack_988 = boost::foreach_detail_::
                   end<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                             (local_928,
                              (type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                               *)0x0,(false_ *)0x0);
      local_980 = (auto_any_base *)&stack0xfffffffffffff678;
      bVar2 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_980);
      if (!bVar2) {
        v_1._7_1_ = 1;
        while( true ) {
          local_eb2 = 0;
          if ((v_1._7_1_ & 1) != 0) {
            bVar2 = boost::foreach_detail_::
                    done<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                              (local_970,local_980,
                               (type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                                *)0x0);
            local_eb2 = bVar2 ^ 0xff;
          }
          if ((local_eb2 & 1) == 0) break;
          bVar2 = boost::foreach_detail_::set_false((bool *)((long)&v_1 + 7));
          if (!bVar2) {
            local_998 = boost::foreach_detail_::
                        deref<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                                  (local_970,
                                   (type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                                    *)0x0);
            while (((v_1._7_1_ ^ 0xff) & 1) != 0) {
              pcVar11 = (char *)std::__cxx11::string::data();
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (local_9b8,pcVar11,
                         (allocator<char> *)(sourceSpaceName.field_2._M_local_buf + 0xf));
              iVar3 = std::__cxx11::string::compare((char *)local_9b8);
              std::__cxx11::string::~string(local_9b8);
              std::allocator<char>::~allocator
                        ((allocator<char> *)(sourceSpaceName.field_2._M_local_buf + 0xf));
              if (iVar3 == 0) {
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::pair(&local_a28,local_998);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_a48,"name",(allocator<char> *)((long)&foundDot_2 + 7));
                GetAttr((string *)local_9e0,&local_a28,&local_a48);
                std::__cxx11::string::~string((string *)&local_a48);
                std::allocator<char>::~allocator((allocator<char> *)((long)&foundDot_2 + 7));
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~pair(&local_a28);
                local_a58 = std::__cxx11::string::find_first_of((char)local_9e0,0x2e);
                if (local_a58 != -1) {
                  std::__cxx11::string::substr((ulong)&_foreach_col181,(ulong)local_9e0);
                  std::__cxx11::string::operator=((string *)local_9e0,(string *)&_foreach_col181);
                  std::__cxx11::string::~string((string *)&_foreach_col181);
                }
                _foreach_cur181 =
                     (auto_any_t)
                     boost::foreach_detail_::
                     contain<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>
                               (&local_998->second,(false_ *)0x0);
                local_a80 = (auto_any_t)&_foreach_cur181;
                bVar2 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_a80);
                if (!bVar2) {
                  _foreach_end181 =
                       (auto_any_t)
                       boost::foreach_detail_::
                       begin<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                                 (local_a80,
                                  (type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                                   *)0x0,(false_ *)0x0);
                  local_a90 = (auto_any_base *)&_foreach_end181;
                  bVar2 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_a90);
                  if (!bVar2) {
                    aStack_aa8 = boost::foreach_detail_::
                                 end<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                                           (local_a80,
                                            (type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                                             *)0x0,(false_ *)0x0);
                    local_aa0 = (auto_any_base *)&stack0xfffffffffffff558;
                    bVar2 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_aa0);
                    if (!bVar2) {
                      i_2._7_1_ = 1;
                      while( true ) {
                        local_f0a = 0;
                        if ((i_2._7_1_ & 1) != 0) {
                          bVar2 = boost::foreach_detail_::
                                  done<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                                            (local_a90,local_aa0,
                                             (type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                                              *)0x0);
                          local_f0a = bVar2 ^ 0xff;
                        }
                        if ((local_f0a & 1) == 0) break;
                        bVar2 = boost::foreach_detail_::set_false((bool *)((long)&i_2 + 7));
                        if (!bVar2) {
                          local_ab8 = boost::foreach_detail_::
                                      deref<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                                                (local_a90,
                                                 (type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                                                  *)0x0);
                          while (((i_2._7_1_ ^ 0xff) & 1) != 0) {
                            pcVar11 = (char *)std::__cxx11::string::data();
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      (local_ad8,pcVar11,
                                       (allocator<char> *)((long)&_foreach_col187 + 7));
                            iVar3 = std::__cxx11::string::compare((char *)local_ad8);
                            std::__cxx11::string::~string(local_ad8);
                            std::allocator<char>::~allocator
                                      ((allocator<char> *)((long)&_foreach_col187 + 7));
                            if (iVar3 == 0) {
                              this_00 = &local_ab8->second;
                              boost::property_tree::
                              string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::string_path(&local_b20,"<xmlattr>",0x2e);
                              psVar5 = boost::property_tree::
                                       basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::get_child(this_00,&local_b20);
                              local_af0 = (basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)boost::foreach_detail_::
                                             contain<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>
                                                       (psVar5,(false_ *)0x0);
                              boost::property_tree::
                              string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~string_path(&local_b20);
                              local_ae8 = (auto_any_t)&local_af0;
                              bVar2 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool
                                                (local_ae8);
                              if (!bVar2) {
                                _foreach_end187 =
                                     (auto_any_t)
                                     boost::foreach_detail_::
                                     begin<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                                               (local_ae8,
                                                (type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                                                 *)0x0,(false_ *)0x0);
                                local_b30 = (auto_any_base *)&_foreach_end187;
                                bVar2 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool
                                                  (local_b30);
                                if (!bVar2) {
                                  aStack_b48 = boost::foreach_detail_::
                                               end<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                                                         (local_ae8,
                                                          (
                                                  type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                                                  *)0x0,(false_ *)0x0);
                                  local_b40 = (auto_any_base *)&stack0xfffffffffffff4b8;
                                  bVar2 = boost::foreach_detail_::auto_any_base::
                                          operator_cast_to_bool(local_b40);
                                  if (!bVar2) {
                                    j._7_1_ = 1;
                                    while( true ) {
                                      local_f6a = 0;
                                      if ((j._7_1_ & 1) != 0) {
                                        bVar2 = boost::foreach_detail_::
                                                done<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                                                          (local_b30,local_b40,
                                                           (
                                                  type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                                                  *)0x0);
                                        local_f6a = bVar2 ^ 0xff;
                                      }
                                      if ((local_f6a & 1) == 0) break;
                                      bVar2 = boost::foreach_detail_::set_false
                                                        ((bool *)((long)&j + 7));
                                      if (!bVar2) {
                                        local_b58 = boost::foreach_detail_::
                                                                                                        
                                                  deref<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                                                            (local_b30,
                                                             (
                                                  type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                                                  *)0x0);
                                        while (((j._7_1_ ^ 0xff) & 1) != 0) {
                                          pcVar11 = (char *)std::__cxx11::string::data();
                                          std::allocator<char>::allocator();
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    (local_b78,pcVar11,
                                                     (allocator<char> *)
                                                     (targetSpaceName.field_2._M_local_buf + 0xf));
                                          iVar3 = std::__cxx11::string::compare((char *)local_b78);
                                          std::__cxx11::string::~string(local_b78);
                                          std::allocator<char>::~allocator
                                                    ((allocator<char> *)
                                                     (targetSpaceName.field_2._M_local_buf + 0xf));
                                          if (iVar3 == 0) {
                                            pdVar12 = boost::property_tree::
                                                                                                            
                                                  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::data(&local_b58->second);
                                            std::__cxx11::string::string
                                                      ((string *)&foundDot_3,(string *)pdVar12);
                                            local_ba8 = std::__cxx11::string::find_first_of
                                                                  ((char)&foundDot_3,0x2e);
                                            if (local_ba8 != -1) {
                                              std::__cxx11::string::substr
                                                        ((ulong)&v1,(ulong)&foundDot_3);
                                              std::__cxx11::string::operator=
                                                        ((string *)&foundDot_3,(string *)&v1);
                                              std::__cxx11::string::~string((string *)&v1);
                                            }
                                            sVar13 = std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                                                  ::count((
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                                                  *)local_98,(key_type *)&foundDot_3);
                                            if ((sVar13 != 0) &&
                                               (sVar13 = std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                                                  ::count((
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                                                  *)local_98,(key_type *)local_9e0), sVar13 != 0)) {
                                              ppvVar14 = std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                                                  ::operator[]((
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                                                  *)local_98,(key_type *)local_9e0);
                                              this = (boost *)*ppvVar14;
                                              ppvVar14 = std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                                                  ::operator[]((
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                                                  *)local_98,(key_type *)&foundDot_3);
                                              ret._24_8_ = *ppvVar14;
                                              boost::
                                              edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>,boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>,boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>::config>>
                                                        ((
                                                  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_bool>
                                                  *)local_bf8,this,(vertex_descriptor)ret._24_8_,
                                                  outGraph,in_R8);
                                              if ((((byte)ret.first.m_eproperty & 1) == 0) &&
                                                 (iVar3 = std::__cxx11::string::compare
                                                                    ((string *)&foundDot_3),
                                                 iVar3 != 0)) {
                                                boost::
                                                add_edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>,boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>::config>
                                                          (&local_c18,this,
                                                           (vertex_descriptor)ret._24_8_,outGraph,
                                                           (
                                                  undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>::config>
                                                  *)in_R8);
                                              }
                                            }
                                            std::__cxx11::string::~string((string *)&foundDot_3);
                                          }
                                          j._7_1_ = 1;
                                        }
                                      }
                                      if ((j._7_1_ & 1) != 0) {
                                        boost::foreach_detail_::
                                        next<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                                                  (local_b30,
                                                   (
                                                  type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                                                  *)0x0);
                                      }
                                    }
                                  }
                                }
                              }
                            }
                            i_2._7_1_ = 1;
                          }
                        }
                        if ((i_2._7_1_ & 1) != 0) {
                          boost::foreach_detail_::
                          next<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                                    (local_a90,
                                     (type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                                      *)0x0);
                        }
                      }
                    }
                  }
                }
                std::__cxx11::string::~string((string *)local_9e0);
              }
              v_1._7_1_ = 1;
            }
          }
          if ((v_1._7_1_ & 1) != 0) {
            boost::foreach_detail_::
            next<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                      (local_970,
                       (type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                        *)0x0);
          }
        }
      }
    }
  }
  foundDot._7_1_ = 1;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
          *)local_98);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree((basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_50);
  return __return_storage_ptr__;
}

Assistant:

static graphProperties loadGraphFromXML(std::string filenamePath, floorplanGraph& outGraph, std::string rootNodeName){
        ptree XMLtree;
        read_xml(filenamePath, XMLtree);
        map<string, Vertex> nameToVertex;
        graphProperties currentGraphProperty;
        currentGraphProperty.filepath = filenamePath;

        size_t foundDot = filenamePath.find_last_of('/');
        if (foundDot != string::npos)
            currentGraphProperty.floorname = filenamePath.substr(foundDot+1, filenamePath.size()-1);
        else
            currentGraphProperty.floorname = filenamePath;

        BOOST_FOREACH(ptree::value_type &v, XMLtree.get_child(rootNodeName.c_str()))
        {
            if( ((string)v.first.data()).compare("space") == 0 )
            {
                string spaceName = GetAttr(v, "name");
                string spaceType = GetAttr(v, "type");

                size_t foundDot = spaceName.find_first_of('.');
                if (foundDot != string::npos)
                    spaceName = spaceName.substr(0, foundDot);


                if (!spaceName.empty()){
                    pair<bool,Vertex> searchResult =  GraphUtils::doesVertexExists(spaceName, outGraph);
                    Vertex currentVertex;
                    if (!searchResult.first){
                        currentVertex = add_vertex(outGraph);
                        outGraph[currentVertex].category  =  spaceType ;
                        outGraph[currentVertex].vertex_id =  spaceName;
                        nameToVertex[spaceName] = currentVertex;
                    }
                    else {

                        currentVertex = searchResult.second;
                    }
                    // For each space's children
                    BOOST_FOREACH(ptree::value_type &i,
                                  v.second)
                    {
                        if (((string)i.first.data()).compare("contour") == 0){
                            vector<Point2D> points;
                            BOOST_FOREACH(ptree::value_type &l,
                                          i.second)
                            {

                                char* endptr;
                                if( ((string)l.first.data()).compare("centroid") == 0 ){
                                    outGraph[currentVertex].centroid.x = strtod(GetAttr(l, "x").c_str(), &endptr);
                                    outGraph[currentVertex].centroid.y = strtod(GetAttr(l, "y").c_str(), &endptr);
                                }
                                if( ((string)l.first.data()).compare("extent") == 0 ){

                                    outGraph[currentVertex].maxx = strtod(GetAttr(l, "maxx").c_str(), &endptr);
                                    outGraph[currentVertex].maxy = strtod(GetAttr(l, "maxy").c_str(), &endptr);
                                    outGraph[currentVertex].minx = strtod(GetAttr(l, "minx").c_str(), &endptr);
                                    outGraph[currentVertex].miny = strtod(GetAttr(l, "miny").c_str(), &endptr);
                                }
                                if( ((string)l.first.data()).compare("point") == 0 ){
                                    points.push_back(Point2D(strtod(GetAttr(l, "x").c_str(), &endptr), strtod(GetAttr(l, "y").c_str(), &endptr)));
                                }
                            } // for each contour children

                            if(points.size() > 0){
                                LineSegment lsegment;
                                for (int i=0; i < points.size(); i++){
                                    if(i == points.size()-1){
                                        lsegment.startPos = points[i];
                                        lsegment.endPos = points[0];
                                    }
                                    else{
                                        lsegment.startPos = points[i];
                                        lsegment.endPos = points[i+1];
                                    }
                                    outGraph[currentVertex].roomLayout.push_back(lsegment);
                                }
                            }

                        } // if it's a contour

                    } // for each space children
                } // if space with an non-empty name
            } // if space
        }


        // now add edges

        BOOST_FOREACH(ptree::value_type &v, XMLtree.get_child(rootNodeName.c_str()))
        {
            if( ((string)v.first.data()).compare("space") == 0 )
            {
                string sourceSpaceName = GetAttr(v, "name");
                size_t foundDot = sourceSpaceName.find_first_of('.');
                if (foundDot != string::npos)
                    sourceSpaceName = sourceSpaceName.substr(0, foundDot);
                BOOST_FOREACH(ptree::value_type &i,
                              v.second)
                {
                    if( ((string)i.first.data()).compare("portal") == 0 )
                    {

                        BOOST_FOREACH(ptree::value_type &j,
                                      i.second.get_child("<xmlattr>"))
                        {
                            if( ((string)j.first.data()).compare("target") == 0 )
                            {
                                string targetSpaceName = (string)j.second.data();
                                size_t foundDot = targetSpaceName.find_first_of('.');
                                if (foundDot != string::npos)
                                    targetSpaceName = targetSpaceName.substr(0, foundDot);

                                if (nameToVertex.count(targetSpaceName) != 0 && nameToVertex.count(sourceSpaceName) !=  0) {
                                    Vertex v1 = nameToVertex[sourceSpaceName];
                                    Vertex v2 = nameToVertex[targetSpaceName];
                                    pair<Edge, bool> ret = boost::edge(v1, v2, outGraph);
                                    if (!ret.second && targetSpaceName.compare(sourceSpaceName) != 0){
                                        add_edge(v1, v2, outGraph);
                                    } // if edge does not already exists and target,source are not the same
                                } // if both target and source exists in the graph
                            } // if it's a target attribute
                        } // for each portal's attributes
                    } // if this is a portal

                } // for each element of space
            } // if this is a space
        } // Adding edges end

        return currentGraphProperty;
    }